

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O3

void __thiscall
boost::exception_detail::
clone_impl<boost::exception_detail::error_info_injector<boost::system::system_error>_>::clone_impl
          (clone_impl<boost::exception_detail::error_info_injector<boost::system::system_error>_>
           *this,error_info_injector<boost::system::system_error> *x)

{
  pointer pcVar1;
  error_info_container *peVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  char *pcVar6;
  
  *(undefined ***)&this->field_0x68 = &PTR___cxa_pure_virtual_001cb0c8;
  std::runtime_error::runtime_error((runtime_error *)this,(runtime_error *)x);
  *(undefined ***)&(this->super_error_info_injector<boost::system::system_error>).super_system_error
       = &PTR__system_error_001c9428;
  uVar3 = *(undefined4 *)&(x->super_system_error).m_error_code.field_0x4;
  uVar4 = *(undefined4 *)&(x->super_system_error).m_error_code.m_cat;
  uVar5 = *(undefined4 *)((long)&(x->super_system_error).m_error_code.m_cat + 4);
  (this->super_error_info_injector<boost::system::system_error>).super_system_error.m_error_code.
  m_val = (x->super_system_error).m_error_code.m_val;
  *(undefined4 *)
   &(this->super_error_info_injector<boost::system::system_error>).super_system_error.m_error_code.
    field_0x4 = uVar3;
  *(undefined4 *)
   &(this->super_error_info_injector<boost::system::system_error>).super_system_error.m_error_code.
    m_cat = uVar4;
  *(undefined4 *)
   ((long)&(this->super_error_info_injector<boost::system::system_error>).super_system_error.
           m_error_code.m_cat + 4) = uVar5;
  (this->super_error_info_injector<boost::system::system_error>).super_system_error.m_what.
  _M_dataplus._M_p =
       (pointer)&(this->super_error_info_injector<boost::system::system_error>).super_system_error.
                 m_what.field_2;
  pcVar1 = (x->super_system_error).m_what._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)
             &(this->super_error_info_injector<boost::system::system_error>).super_system_error.
              m_what,pcVar1,pcVar1 + (x->super_system_error).m_what._M_string_length);
  (this->super_error_info_injector<boost::system::system_error>).super_exception._vptr_exception =
       (_func_int **)&PTR___cxa_pure_virtual_001cb168;
  peVar2 = (x->super_exception).data_.px_;
  (this->super_error_info_injector<boost::system::system_error>).super_exception.data_.px_ = peVar2;
  if (peVar2 != (error_info_container *)0x0) {
    (**(code **)(*(long *)peVar2 + 0x18))();
  }
  (this->super_error_info_injector<boost::system::system_error>).super_exception.throw_line_ =
       (x->super_exception).throw_line_;
  pcVar6 = (x->super_exception).throw_file_;
  (this->super_error_info_injector<boost::system::system_error>).super_exception.throw_function_ =
       (x->super_exception).throw_function_;
  (this->super_error_info_injector<boost::system::system_error>).super_exception.throw_file_ =
       pcVar6;
  *(undefined8 *)&(this->super_error_info_injector<boost::system::system_error>).super_system_error
       = 0x1cbd50;
  (this->super_error_info_injector<boost::system::system_error>).super_exception._vptr_exception =
       (_func_int **)0x1cbd88;
  *(undefined8 *)&this->field_0x68 = 0x1cbdc0;
  copy_boost_exception
            (&(this->super_error_info_injector<boost::system::system_error>).super_exception,
             &x->super_exception);
  return;
}

Assistant:

explicit
            clone_impl( T const & x ):
                T(x)
                {
                copy_boost_exception(this,&x);
                }